

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O3

bool duckdb::TrySimpleIntegerCast<long,true>(char *buf,idx_t len,long *result,bool strict)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  byte bVar8;
  ushort uVar9;
  duckdb *pdVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int16_t local_5a;
  IntegerDecimalCastData<long> local_58;
  ulong local_40;
  ulong local_38;
  
  if (len == 0) {
    return false;
  }
  uVar3 = 0;
  do {
    bVar6 = buf[uVar3];
    if ((4 < bVar6 - 9) && (bVar6 != 0x20)) {
      if (bVar6 == 0x2d) {
        if (len - 1 != uVar3) {
          uVar11 = len - uVar3;
          uVar12 = 1;
          lVar2 = 0;
          goto LAB_00d09590;
        }
        break;
      }
      if (bVar6 == 0x30 && len - 1 != uVar3) {
        bVar5 = buf[uVar3 + 1];
        if (bVar5 < 0x62) {
          if (bVar5 == 0x42) {
LAB_00d0985b:
            uVar11 = ~uVar3 + len;
            if (1 < uVar11) {
              uVar12 = 1;
              lVar2 = 0;
              goto LAB_00d09881;
            }
            break;
          }
          if (bVar5 == 0x58) {
LAB_00d09739:
            uVar11 = ~uVar3 + len;
            if (1 < uVar11) {
              uVar12 = 1;
              lVar2 = 0;
              goto LAB_00d09769;
            }
            break;
          }
        }
        else {
          if (bVar5 == 0x62) goto LAB_00d0985b;
          if (bVar5 == 0x78) goto LAB_00d09739;
        }
      }
      uVar12 = len - uVar3;
      uVar11 = (ulong)(bVar6 == 0x2b);
      if (uVar12 <= uVar11) {
        lVar2 = 0;
        uVar18 = 1;
        goto LAB_00d099f1;
      }
      lVar2 = 0;
      uVar7 = uVar11;
      goto LAB_00d09689;
    }
    uVar3 = uVar3 + 1;
  } while (len != uVar3);
  goto LAB_00d09a2d;
  while( true ) {
    uVar7 = (0x8000000000000000 - (ulong)bVar6) / 10;
    if (SBORROW8(lVar2,-uVar7) != (long)(lVar2 + uVar7) < 0) goto LAB_00d09a2d;
    lVar2 = lVar2 * 10 - (ulong)bVar6;
    uVar18 = uVar11;
    if (~uVar12 + len == uVar3) break;
    if (buf[uVar3 + 1 + uVar12] == '_') {
      if (((len - uVar12) - 2 == uVar3) ||
         (uVar12 = uVar12 + 2, 9 < (byte)(buf[uVar3 + uVar12] - 0x30U))) goto LAB_00d09a2d;
    }
    else {
      uVar12 = uVar12 + 1;
    }
    uVar18 = uVar12;
    if (uVar11 <= uVar12) break;
LAB_00d09590:
    bVar5 = buf[uVar3 + uVar12];
    bVar6 = bVar5 - 0x30;
    if (9 < bVar6) {
      uVar7 = uVar12;
      if (bVar5 == 0x2e) {
        uVar7 = uVar12 + 1;
        uVar18 = uVar12;
        if (uVar11 <= uVar7) break;
        if ((uVar12 < 2) || (bVar5 = buf[uVar3 + 1 + uVar12], (byte)(bVar5 - 0x30) < 10))
        goto LAB_00d09a2d;
      }
      if ((4 < bVar5 - 9) && (bVar5 != 0x20)) goto LAB_00d09a2d;
      uVar7 = uVar7 + 1;
      uVar18 = uVar7;
      if (uVar7 < uVar11) goto LAB_00d09955;
      break;
    }
  }
  goto joined_r0x00d09a0a;
  while (uVar7 = uVar7 + 1, uVar18 = uVar11, uVar11 != uVar7) {
LAB_00d09955:
    if ((4 < (byte)buf[uVar3 + uVar7] - 9) && (buf[uVar3 + uVar7] != 0x20)) goto LAB_00d09a2d;
  }
joined_r0x00d09a0a:
  if (1 < uVar18) goto LAB_00d099f6;
  goto LAB_00d09a2d;
  while( true ) {
    uVar7 = uVar11;
    if ((len - uVar12) - 2 != uVar3) {
      if (buf[uVar3 + 2 + uVar12] == '_') {
        if (((len - uVar12) - 3 == uVar3) || ((buf[uVar3 + 3 + uVar12] & 0xfeU) != 0x30))
        goto LAB_00d09a2d;
        uVar7 = uVar12 + 2;
      }
      else {
        uVar7 = uVar12 + 1;
      }
    }
    uVar12 = uVar7;
    if (0x3fffffffffffffff < lVar2) goto LAB_00d09a2d;
    lVar2 = lVar13 + lVar2 * 2;
    if (uVar11 <= uVar12) break;
LAB_00d09881:
    if (buf[uVar3 + 1 + uVar12] == '0') {
      lVar13 = 0;
    }
    else {
      if (buf[uVar3 + 1 + uVar12] != '1') goto LAB_00d09a2d;
      lVar13 = 1;
    }
  }
  goto LAB_00d099f6;
  while( true ) {
    uVar12 = uVar7;
    if ((long)((ulong)(bVar6 >> 4) ^ 0x7ffffffffffffff) < lVar2) goto LAB_00d09a2d;
    lVar2 = lVar2 * 0x10 + (ulong)bVar6;
    if (uVar11 <= uVar12) break;
LAB_00d09769:
    bVar6 = buf[uVar3 + 1 + uVar12];
    bVar5 = bVar6 | 0x20;
    if (0x19 < (byte)(bVar6 + 0xbf)) {
      bVar5 = bVar6;
    }
    if ((byte)(bVar5 + 0x9f) < 6 || (byte)(bVar5 - 0x30) < 10) {
      bVar6 = bVar5 + 0xa9;
      if (bVar5 < 0x61) {
        bVar6 = bVar5 - 0x30;
      }
    }
    else {
      bVar6 = bVar5 - 0x30;
      if (5 < (byte)(bVar5 + 0xbf)) goto LAB_00d09a2d;
    }
    uVar7 = uVar11;
    if ((len - uVar12) - 2 != uVar3) {
      if (buf[uVar3 + 2 + uVar12] == '_') {
        if ((len - uVar12) - 3 == uVar3) goto LAB_00d09a2d;
        uVar7 = uVar12 + 2;
        if ((9 < (byte)(buf[uVar3 + 3 + uVar12] - 0x30U)) &&
           ((uVar14 = (byte)buf[uVar3 + 3 + uVar12] - 0x41, 0x25 < uVar14 ||
            ((0x3f0000003fU >> ((ulong)uVar14 & 0x3f) & 1) == 0)))) goto LAB_00d09a2d;
      }
      else {
        uVar7 = uVar12 + 1;
      }
    }
  }
  goto LAB_00d099f6;
  while( true ) {
    if ((long)(((ulong)bVar5 ^ 0x7ffffffffffffffe) / 10) < lVar2) goto LAB_00d09a2d;
    lVar2 = lVar2 * 10 + (ulong)bVar5;
    uVar18 = uVar12;
    if (~uVar7 + len == uVar3) break;
    if (buf[uVar3 + 1 + uVar7] == '_') {
      if (((len - uVar7) - 2 == uVar3) ||
         (uVar7 = uVar7 + 2, 9 < (byte)(buf[uVar3 + uVar7] - 0x30U))) goto LAB_00d09a2d;
    }
    else {
      uVar7 = uVar7 + 1;
    }
    uVar18 = uVar7;
    if (uVar12 <= uVar7) break;
LAB_00d09689:
    bVar6 = buf[uVar3 + uVar7];
    bVar5 = bVar6 - 0x30;
    if (9 < bVar5) {
      uVar18 = uVar7;
      if (bVar6 == 0x2e) {
        uVar18 = uVar7 + 1;
        if (uVar12 <= uVar18) {
          if (uVar7 <= uVar11) goto LAB_00d09a2d;
          break;
        }
        if ((uVar7 <= uVar11) || (bVar6 = buf[uVar3 + 1 + uVar7], (byte)(bVar6 - 0x30) < 10))
        goto LAB_00d09a2d;
      }
      if ((4 < bVar6 - 9) && (bVar6 != 0x20)) goto LAB_00d09a2d;
      uVar7 = uVar18 + 1;
      uVar18 = uVar7;
      if (uVar7 < uVar12) goto LAB_00d099cb;
      break;
    }
  }
  goto LAB_00d099f1;
LAB_00d09e4a:
  bVar6 = buf[uVar3 + uVar7];
  bVar5 = bVar6 - 0x30;
  local_40 = uVar18;
  if (9 < bVar5) {
    local_58._18_6_ = 0;
    if (uVar7 <= uVar18 && uVar12 < 2) {
      return false;
    }
LAB_00d0a05b:
    uVar14 = (uint)bVar6;
    if (bVar6 < 0x20) {
      if (4 < uVar14 - 9) {
        return false;
      }
LAB_00d0a071:
      uVar7 = uVar7 + 1;
      uVar17 = uVar7;
      if (uVar7 < uVar11) {
        do {
          if ((4 < (byte)buf[uVar3 + uVar7] - 9) && (buf[uVar3 + uVar7] != 0x20)) {
            return false;
          }
          uVar7 = uVar7 + 1;
          uVar17 = uVar11;
        } while (uVar11 != uVar7);
      }
      goto LAB_00d09eea;
    }
    if ((bVar6 != 0x65) && (uVar14 != 0x45)) {
      if (uVar14 != 0x20) {
        return false;
      }
      goto LAB_00d0a071;
    }
    if (uVar7 == 1) {
      return false;
    }
    if (uVar11 <= uVar7 + 1) {
      return false;
    }
    local_5a = 0;
    pdVar10 = (duckdb *)(buf + uVar3 + uVar7 + 1);
    pcVar4 = (char *)(~uVar3 + (len - uVar7));
    if (*pdVar10 == (duckdb)0x2d) {
      bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pdVar10,pcVar4,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar4,bVar1);
    }
    else {
      bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pdVar10,pcVar4,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar4,bVar1);
    }
    if (bVar1 == false) {
      return false;
    }
    bVar1 = IntegerDecimalCastOperation::HandleExponent<duckdb::IntegerDecimalCastData<long>,true>
                      (&local_58,local_5a);
    goto LAB_00d09df6;
  }
  if (local_58.decimal <= (long)(((ulong)bVar5 ^ 0x7ffffffffffffffe) / 10)) {
    local_58.decimal_digits = uVar9 + 1;
    local_58.decimal = (ulong)bVar5 + local_58.decimal * 10;
    uVar9 = local_58.decimal_digits;
  }
  uVar17 = uVar11;
  if (~uVar7 + len != uVar3) goto code_r0x00d09e9d;
  goto LAB_00d0a10b;
code_r0x00d09e9d:
  if (buf[uVar3 + 1 + uVar7] == '_') {
    if ((len - uVar7) - 2 == uVar3) {
      return false;
    }
    uVar7 = uVar7 + 2;
    if (9 < (byte)(buf[uVar3 + uVar7] - 0x30U)) {
      return false;
    }
  }
  else {
    uVar7 = uVar7 + 1;
  }
  uVar17 = uVar7;
  if (uVar11 <= uVar7) goto LAB_00d0a10b;
  goto LAB_00d09e4a;
LAB_00d0a10b:
  local_58._18_6_ = 0;
LAB_00d0a11b:
  if ((uVar12 < 2) && (uVar17 <= uVar18)) {
    return false;
  }
  goto LAB_00d09eea;
LAB_00d09f3f:
  uVar15 = uVar16;
  bVar6 = buf[uVar3 + uVar18];
  bVar5 = bVar6 - 0x30;
  local_38 = uVar17;
  if (9 < bVar5) {
    local_58._16_8_ = uVar15 & 0xffff;
    if (uVar18 <= uVar17 && uVar7 <= uVar12) {
      return false;
    }
LAB_00d0a156:
    uVar14 = (uint)bVar6;
    if (0x1f < bVar6) {
      if ((bVar6 != 0x65) && (uVar14 != 0x45)) {
        if (uVar14 != 0x20) {
          return false;
        }
        goto LAB_00d0a16c;
      }
      if (uVar18 == uVar12) {
        return false;
      }
      if (uVar11 <= uVar18 + 1) {
        return false;
      }
      local_5a = 0;
      pdVar10 = (duckdb *)(buf + uVar3 + uVar18 + 1);
      pcVar4 = (char *)(~uVar3 + (len - uVar18));
      if (*pdVar10 == (duckdb)0x2d) {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pdVar10,pcVar4,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar4,bVar1);
      }
      else {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pdVar10,pcVar4,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar4,bVar1);
      }
      if (bVar1 == false) {
        return false;
      }
      bVar1 = IntegerDecimalCastOperation::
              HandleExponent<duckdb::IntegerDecimalCastData<long>,false>(&local_58,local_5a);
      goto LAB_00d09df6;
    }
    if (4 < uVar14 - 9) {
      return false;
    }
LAB_00d0a16c:
    uVar18 = uVar18 + 1;
    uVar19 = uVar18;
    if (uVar18 < uVar11) {
      do {
        if ((4 < (byte)buf[uVar3 + uVar18] - 9) && (buf[uVar3 + uVar18] != 0x20)) {
          return false;
        }
        uVar18 = uVar18 + 1;
        uVar19 = uVar11;
      } while (uVar11 != uVar18);
    }
    goto LAB_00d0a009;
  }
  uVar16 = uVar15;
  if (local_58.decimal <= (long)(((ulong)bVar5 ^ 0x7ffffffffffffffe) / 10)) {
    uVar14 = uVar14 + 1;
    local_58.decimal = local_58.decimal * 10 + (ulong)bVar5;
    uVar16 = (ulong)uVar14;
  }
  uVar19 = uVar11;
  local_40 = uVar15;
  if (~uVar18 + len != uVar3) goto code_r0x00d09fad;
  goto LAB_00d0a1fe;
code_r0x00d09fad:
  if (buf[uVar3 + 1 + uVar18] == '_') {
    if ((len - uVar18) - 2 == uVar3) {
      return false;
    }
    uVar18 = uVar18 + 2;
    if (9 < (byte)(buf[uVar3 + uVar18] - 0x30U)) {
      return false;
    }
  }
  else {
    uVar18 = uVar18 + 1;
  }
  uVar19 = uVar18;
  if (uVar11 <= uVar18) goto LAB_00d0a1fe;
  goto LAB_00d09f3f;
LAB_00d0a1fe:
  local_58._16_8_ = uVar16 & 0xffff;
LAB_00d0a20e:
  if ((uVar7 <= uVar12) && (uVar19 <= uVar17)) {
    return false;
  }
  goto LAB_00d0a009;
  while (uVar7 = uVar7 + 1, uVar18 = uVar12, uVar12 != uVar7) {
LAB_00d099cb:
    if ((4 < (byte)buf[uVar3 + uVar7] - 9) && (buf[uVar3 + uVar7] != 0x20)) goto LAB_00d09a2d;
  }
LAB_00d099f1:
  if (uVar11 < uVar18) {
LAB_00d099f6:
    *result = lVar2;
    return true;
  }
LAB_00d09a2d:
  uVar3 = 0;
  while ((bVar6 = buf[uVar3], bVar6 - 9 < 5 || (bVar6 == 0x20))) {
    uVar3 = uVar3 + 1;
    if (len == uVar3) {
      return false;
    }
  }
  local_58.result = 0;
  local_58.decimal = 0;
  local_58._16_8_ = 0;
  uVar11 = len - uVar3;
  bVar1 = SUB81(uVar11,0);
  if (bVar6 == 0x2d) {
    if (len - 1 == uVar3) {
      IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,true>(&local_58);
      return false;
    }
    uVar12 = 1;
    local_58.result = 0;
    do {
      bVar6 = buf[uVar3 + uVar12];
      bVar5 = bVar6 - 0x30;
      if (9 < bVar5) {
        uVar7 = uVar12;
        if (bVar6 != 0x2e) goto LAB_00d0a05b;
        uVar18 = uVar12 + 1;
        uVar17 = uVar18;
        if (uVar11 <= uVar18) goto LAB_00d0a11b;
        local_58.decimal = 0;
        local_58.decimal_digits = 0;
        uVar9 = 0;
        uVar7 = uVar18;
        goto LAB_00d09e4a;
      }
      uVar7 = (0x8000000000000000 - (ulong)bVar5) / 10;
      if (SBORROW8(local_58.result,-uVar7) != (long)(local_58.result + uVar7) < 0) {
        return false;
      }
      local_58.result = local_58.result * 10 - (ulong)bVar5;
      uVar17 = uVar11;
      if (~uVar12 + len == uVar3) break;
      if (buf[uVar3 + 1 + uVar12] == '_') {
        if ((len - uVar12) - 2 == uVar3) {
          return false;
        }
        uVar12 = uVar12 + 2;
        if (9 < (byte)(buf[uVar3 + uVar12] - 0x30U)) {
          return false;
        }
      }
      else {
        uVar12 = uVar12 + 1;
      }
      uVar17 = uVar12;
    } while (uVar12 < uVar11);
LAB_00d09eea:
    bVar1 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,true>
                      (&local_58);
    if (!bVar1) {
      return false;
    }
    if (uVar17 < 2) {
      return false;
    }
    goto LAB_00d0a028;
  }
  if (bVar6 == 0x30 && len - 1 != uVar3) {
    bVar5 = buf[uVar3 + 1];
    if (bVar5 < 0x62) {
      if (bVar5 == 0x42) {
LAB_00d09d59:
        uVar11 = ~uVar3 + len;
        if (uVar11 < 2) goto LAB_00d09dff;
        uVar12 = 1;
        local_58.result = 0;
        do {
          lVar2 = 0;
          if (buf[uVar3 + 1 + uVar12] != '0') {
            if (buf[uVar3 + 1 + uVar12] != '1') {
              return false;
            }
            lVar2 = 1;
          }
          uVar7 = uVar11;
          if ((len - uVar12) - 2 != uVar3) {
            if (buf[uVar3 + 2 + uVar12] == '_') {
              if ((len - uVar12) - 3 == uVar3) {
                return false;
              }
              if ((buf[uVar3 + 3 + uVar12] & 0xfeU) != 0x30) {
                return false;
              }
              uVar7 = uVar12 + 2;
            }
            else {
              uVar7 = uVar12 + 1;
            }
          }
          uVar12 = uVar7;
          if (0x3fffffffffffffff < local_58.result) {
            return false;
          }
          local_58.result = lVar2 + local_58.result * 2;
        } while (uVar12 < uVar11);
      }
      else {
        if (bVar5 != 0x58) goto LAB_00d09ab9;
LAB_00d09c38:
        uVar11 = ~uVar3 + len;
        if (uVar11 < 2) goto LAB_00d09dff;
        uVar12 = 1;
        local_58.result = 0;
        do {
          bVar6 = buf[uVar3 + 1 + uVar12];
          bVar5 = bVar6 | 0x20;
          if (0x19 < (byte)(bVar6 + 0xbf)) {
            bVar5 = bVar6;
          }
          bVar6 = bVar5 - 0x30;
          if ((byte)(bVar5 + 0x9f) < 6 || bVar6 < 10) {
            bVar8 = bVar5 + 0xa9;
            if (bVar5 < 0x61) {
              bVar8 = bVar6;
            }
          }
          else {
            bVar8 = bVar6;
            if (5 < (byte)(bVar5 + 0xbf)) {
              return false;
            }
          }
          uVar7 = uVar11;
          if ((len - uVar12) - 2 != uVar3) {
            if (buf[uVar3 + 2 + uVar12] == '_') {
              if ((len - uVar12) - 3 == uVar3) {
                return false;
              }
              uVar7 = uVar12 + 2;
              if (9 < (byte)(buf[uVar3 + 3 + uVar12] - 0x30U)) {
                uVar14 = (byte)buf[uVar3 + 3 + uVar12] - 0x41;
                if (0x25 < uVar14) {
                  return false;
                }
                if ((0x3f0000003fU >> ((ulong)uVar14 & 0x3f) & 1) == 0) {
                  return false;
                }
              }
            }
            else {
              uVar7 = uVar12 + 1;
            }
          }
          uVar12 = uVar7;
          if ((long)((ulong)(bVar8 >> 4) ^ 0x7ffffffffffffff) < local_58.result) {
            return false;
          }
          local_58.result = local_58.result * 0x10 + (ulong)bVar8;
        } while (uVar12 < uVar11);
      }
      bVar1 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                        (&local_58);
LAB_00d09df6:
      if (bVar1 == false) {
        return false;
      }
      goto LAB_00d0a028;
    }
    if (bVar5 == 0x62) goto LAB_00d09d59;
    if (bVar5 == 0x78) goto LAB_00d09c38;
  }
LAB_00d09ab9:
  uVar12 = (ulong)(bVar6 == 0x2b);
  if (uVar11 <= uVar12) {
LAB_00d09dff:
    IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>(&local_58);
    return false;
  }
  local_58.result = 0;
  uVar7 = uVar12;
  do {
    bVar6 = buf[uVar3 + uVar7];
    bVar5 = bVar6 - 0x30;
    if (9 < bVar5) {
      uVar18 = uVar7;
      if (bVar6 != 0x2e) goto LAB_00d0a156;
      uVar17 = uVar7 + 1;
      uVar19 = uVar17;
      if (uVar11 <= uVar17) goto LAB_00d0a20e;
      local_58.decimal = 0;
      uVar14 = 0;
      uVar16 = 0;
      uVar18 = uVar17;
      goto LAB_00d09f3f;
    }
    if ((long)(((ulong)bVar5 ^ 0x7ffffffffffffffe) / 10) < local_58.result) {
      return false;
    }
    local_58.result = local_58.result * 10 + (ulong)bVar5;
    uVar19 = uVar11;
    if (~uVar7 + len == uVar3) break;
    if (buf[uVar3 + 1 + uVar7] == '_') {
      if ((len - uVar7) - 2 == uVar3) {
        return false;
      }
      uVar7 = uVar7 + 2;
      if (9 < (byte)(buf[uVar3 + uVar7] - 0x30U)) {
        return false;
      }
    }
    else {
      uVar7 = uVar7 + 1;
    }
    uVar19 = uVar7;
  } while (uVar7 < uVar11);
LAB_00d0a009:
  bVar1 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                    (&local_58);
  if (!bVar1) {
    return false;
  }
  if (uVar19 <= uVar12) {
    return false;
  }
LAB_00d0a028:
  *result = local_58.result;
  return true;
}

Assistant:

static bool TryIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	// skip any spaces at the start
	while (len > 0 && StringUtil::CharacterIsSpace(*buf)) {
		buf++;
		len--;
	}
	if (len == 0) {
		return false;
	}
	if (ZERO_INITIALIZE) {
		memset(&result, 0, sizeof(T));
	}
	// if the number is negative, we set the negative flag and skip the negative sign
	if (*buf == '-') {
		if (!IS_SIGNED) {
			// Need to check if its not -0
			idx_t pos = 1;
			while (pos < len) {
				if (buf[pos++] != '0') {
					return false;
				}
			}
		}
		return IntegerCastLoop<T, true, ALLOW_EXPONENT, OP, decimal_separator>(buf, len, result, strict);
	}
	if (len > 1 && *buf == '0') {
		if (buf[1] == 'x' || buf[1] == 'X') {
			// If it starts with 0x or 0X, we parse it as a hex value
			buf++;
			len--;
			return IntegerHexCastLoop<T, false, false, OP>(buf, len, result, strict);
		} else if (buf[1] == 'b' || buf[1] == 'B') {
			// If it starts with 0b or 0B, we parse it as a binary value
			buf++;
			len--;
			return IntegerBinaryCastLoop<T, false, false, OP>(buf, len, result, strict);
		} else if (strict && StringUtil::CharacterIsDigit(buf[1])) {
			// leading zeros are not allowed in strict mode
			return false;
		}
	}
	return IntegerCastLoop<T, false, ALLOW_EXPONENT, OP, decimal_separator>(buf, len, result, strict);
}